

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Runtime::LogBytecode(Runtime *this,Parser *parser)

{
  uint uVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  RuntimeID RVar6;
  String local_6d8;
  ValueType local_6b8;
  uint local_6b4;
  ValueType type_1;
  int32_t stackIndex;
  RuntimeID id_2;
  String local_688;
  String local_668;
  undefined1 local_648 [8];
  Variant val;
  undefined1 local_618 [4];
  uint32_t count;
  PropertyName propertyName;
  String name;
  undefined1 local_578 [8];
  FunctionSignature signature;
  ValueType type;
  uint8_t b;
  RuntimeID local_f0;
  RuntimeID id_1;
  undefined1 local_e0 [4];
  uint32_t subscripts;
  RuntimeID local_c0;
  RuntimeID id;
  size_t i;
  size_t opcodeNameLength;
  char *opcodeName;
  Opcode opcode;
  uint local_94;
  undefined1 local_90 [3];
  uint8_t opByte;
  int instructionCount;
  String scriptName;
  BytecodeHeader header;
  shared_ptr<Jinx::Buffer> local_58;
  undefined1 local_48 [8];
  BinaryReader reader;
  BufferPtr buffer;
  size_t columnWidth;
  Parser *parser_local;
  Runtime *this_local;
  
  LogWriteLine(Info,"\nBytecode:\n====================");
  Parser::GetBytecode((Parser *)&reader.m_pos);
  std::shared_ptr<Jinx::Buffer>::shared_ptr(&local_58,(shared_ptr<Jinx::Buffer> *)&reader.m_pos);
  BinaryReader::BinaryReader((BinaryReader *)local_48,&local_58);
  std::shared_ptr<Jinx::Buffer>::~shared_ptr(&local_58);
  BytecodeHeader::BytecodeHeader((BytecodeHeader *)((long)&scriptName.field_2 + 8));
  BinaryReader::Read((BinaryReader *)local_48,(void *)((long)&scriptName.field_2 + 8),0xc);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_90);
  BinaryReader::Read((BinaryReader *)local_48,
                     (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_90)
  ;
  local_94 = 0;
  do {
    sVar3 = BinaryReader::Tell((BinaryReader *)local_48);
    if ((ulong)header.signature + 0xc <= sVar3) {
      LogWrite(Info,"\nInstruction Count: %i\n\n",(ulong)local_94);
      opcodeName._4_4_ = 0;
LAB_0010dc8a:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_90);
      BinaryReader::~BinaryReader((BinaryReader *)local_48);
      std::shared_ptr<Jinx::Buffer>::~shared_ptr((shared_ptr<Jinx::Buffer> *)&reader.m_pos);
      return;
    }
    BinaryReader::Read((BinaryReader *)local_48,(byte *)((long)&opcode + 3));
    if (0x34 < (byte)opcode._3_1_) {
      LogWriteLine(Error,"LogBytecode(): Invalid operation in bytecode");
      opcodeName._4_4_ = 1;
      goto LAB_0010dc8a;
    }
    opcodeName._0_4_ = (Opcode)(byte)opcode._3_1_;
    local_94 = local_94 + 1;
    opcodeNameLength = (size_t)GetOpcodeText((Opcode)opcodeName);
    i = strlen((char *)opcodeNameLength);
    LogWrite(Info,(char *)opcodeNameLength);
    if (0xf < i) {
      __assert_fail("opcodeNameLength < columnWidth",
                    "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxRuntime.cpp"
                    ,0xd5,"void Jinx::Impl::Runtime::LogBytecode(const Parser &) const");
    }
    for (id = 0; id < 0x10 - i; id = id + 1) {
      LogWrite(Info," ");
    }
    switch((Opcode)opcodeName) {
    case CallFunc:
    case EraseItr:
    case PushProp:
    case PushVar:
    case SetProp:
    case SetVar:
      BinaryReader::Read((BinaryReader *)local_48,&local_c0);
      Parser::GetNameFromID_abi_cxx11_((String *)local_e0,parser,local_c0);
      pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_e0)
      ;
      LogWrite(Info,"%s",pcVar4);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_e0);
      break;
    case Cast:
      BinaryReader::Read((BinaryReader *)local_48,
                         (uint8_t *)
                         ((long)&signature.m_parts.
                                 super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      signature.m_parts.
      super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           ByteToValueType(signature.m_parts.
                           super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_);
      pcVar4 = GetValueTypeName((ValueType)
                                signature.m_parts.
                                super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      LogWrite(Info,"%s",pcVar4);
      break;
    default:
      break;
    case ErasePropKeyVal:
    case EraseVarKeyVal:
    case SetPropKeyVal:
    case SetVarKeyVal:
      BinaryReader::Read((BinaryReader *)local_48,(uint32_t *)((long)&id_1 + 4));
      BinaryReader::Read((BinaryReader *)local_48,&local_f0);
      uVar1 = id_1._4_4_;
      pcVar4 = "subscripts";
      if (id_1._4_4_ == 1) {
        pcVar4 = "subscript";
      }
      Parser::GetNameFromID_abi_cxx11_((String *)&type,parser,local_f0);
      pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&type);
      LogWrite(Info,"%i %s, %s",(ulong)uVar1,pcVar4,pcVar5);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&type);
      break;
    case Function:
      FunctionSignature::FunctionSignature((FunctionSignature *)local_578);
      FunctionSignature::Read((FunctionSignature *)local_578,(BinaryReader *)local_48);
      RVar6 = FunctionSignature::GetId((FunctionSignature *)local_578);
      Parser::GetNameFromID_abi_cxx11_((String *)((long)&name.field_2 + 8),parser,RVar6);
      pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                     ((long)&name.field_2 + 8));
      LogWrite(Info,"%s",pcVar4);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                    ((long)&name.field_2 + 8));
      FunctionSignature::~FunctionSignature((FunctionSignature *)local_578);
      break;
    case Jump:
    case JumpFalse:
    case JumpFalseCheck:
    case JumpTrue:
    case JumpTrueCheck:
    case PopCount:
    case PushColl:
    case PushList:
      BinaryReader::Read((BinaryReader *)local_48,(uint32_t *)((long)&val.field_1 + 0x1c));
      LogWrite(Info,"%i",(ulong)(uint)val.field_1._28_4_);
      break;
    case Library:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
                ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                 &propertyName.m_partCount);
      BinaryReader::Read((BinaryReader *)local_48,(String *)&propertyName.m_partCount);
      pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                     &propertyName.m_partCount);
      LogWrite(Info,"%s",pcVar4);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                    &propertyName.m_partCount);
      break;
    case Property:
      PropertyName::PropertyName((PropertyName *)local_618);
      PropertyName::Read((PropertyName *)local_618,(BinaryReader *)local_48);
      PropertyName::~PropertyName((PropertyName *)local_618);
      break;
    case PushVal:
      Variant::Variant((Variant *)local_648);
      Variant::Read((Variant *)local_648,(BinaryReader *)local_48);
      bVar2 = Variant::IsString((Variant *)local_648);
      if (bVar2) {
        Variant::GetString_abi_cxx11_(&local_668,(Variant *)local_648);
        pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                 c_str(&local_668);
        LogWrite(Info,"\"%s\"",pcVar4);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
        ~basic_string(&local_668);
      }
      else {
        bVar2 = Variant::IsFunction((Variant *)local_648);
        if (bVar2) {
          RVar6 = Variant::GetFunction((Variant *)local_648);
          Parser::GetNameFromID_abi_cxx11_(&local_688,parser,RVar6);
          pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                   ::c_str(&local_688);
          LogWrite(Info,"%s",pcVar4);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
          ~basic_string(&local_688);
        }
        else {
          Variant::GetString_abi_cxx11_((String *)&id_2,(Variant *)local_648);
          pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                   ::c_str((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                           &id_2);
          LogWrite(Info,"%s",pcVar4);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
          ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&id_2)
          ;
        }
      }
      Variant::~Variant((Variant *)local_648);
      break;
    case SetIndex:
      BinaryReader::Read((BinaryReader *)local_48,(uint64_t *)&type_1);
      BinaryReader::Read((BinaryReader *)local_48,(int32_t *)&local_6b4);
      BinaryReader::Read<Jinx::ValueType,unsigned_char>((BinaryReader *)local_48,&local_6b8);
      Parser::GetNameFromID_abi_cxx11_(&local_6d8,parser,_type_1);
      pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
               c_str(&local_6d8);
      uVar1 = local_6b4;
      pcVar5 = GetValueTypeName(local_6b8);
      LogWrite(Info,"%s %i %s",pcVar4,(ulong)uVar1,pcVar5);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string(&local_6d8);
    }
    LogWrite(Info,"\n");
  } while( true );
}

Assistant:

inline_t void Runtime::LogBytecode(const Parser & parser) const
	{
		LogWriteLine(LogLevel::Info, "\nBytecode:\n====================");
		const size_t columnWidth = 16;
		auto buffer = parser.GetBytecode();
		BinaryReader reader(buffer);
		BytecodeHeader header;
		reader.Read(&header, sizeof(header));
		String scriptName;
		reader.Read(&scriptName);
		int instructionCount = 0;
		while (reader.Tell() < header.dataSize + sizeof(header))
		{
			// Read opcode instruction
			uint8_t opByte;
			reader.Read(&opByte);
			if (opByte >= static_cast<uint32_t>(Opcode::NumOpcodes))
			{
				LogWriteLine(LogLevel::Error, "LogBytecode(): Invalid operation in bytecode");
				return;
			}
			Opcode opcode = static_cast<Opcode>(opByte);

			++instructionCount;

			const char * opcodeName = GetOpcodeText(opcode);
			size_t opcodeNameLength = strlen(opcodeName);
			LogWrite(LogLevel::Info, opcodeName);

			// Advance to column offset
			assert(opcodeNameLength < columnWidth);
			for (size_t i = 0; i < (columnWidth - opcodeNameLength); ++i)
				LogWrite(LogLevel::Info, " ");

			// Read and log opcode arguments
			switch (opcode)
			{
				case Opcode::CallFunc:
				case Opcode::EraseItr:
				case Opcode::PushProp:
				case Opcode::PushVar:
				case Opcode::SetProp:
				case Opcode::SetVar:
				{
					RuntimeID id;
					reader.Read(&id);
					LogWrite(LogLevel::Info, "%s", parser.GetNameFromID(id).c_str());
				}
				break;
				case Opcode::ErasePropKeyVal:
				case Opcode::EraseVarKeyVal:
				case Opcode::SetPropKeyVal:
				case Opcode::SetVarKeyVal:
				{
					uint32_t subscripts;
					reader.Read(&subscripts);
					RuntimeID id;
					reader.Read(&id);
					LogWrite(LogLevel::Info, "%i %s, %s", subscripts, subscripts == 1 ? "subscript" : "subscripts", parser.GetNameFromID(id).c_str());
				}
				break;
				case Opcode::Cast:
				{
					uint8_t b;
					reader.Read(&b);
					auto type = ByteToValueType(b);
					LogWrite(LogLevel::Info, "%s", GetValueTypeName(type));
				}
				break;
				case Opcode::Function:
				{
					FunctionSignature signature;
					signature.Read(reader);
					LogWrite(LogLevel::Info, "%s", parser.GetNameFromID(signature.GetId()).c_str());
				}
				break;
				case Opcode::Library:
				{
					String name;
					reader.Read(&name);
					LogWrite(LogLevel::Info, "%s", name.c_str());
				}
				break;
				case Opcode::Property:
				{
					PropertyName propertyName;
					propertyName.Read(reader);
				}
				break;
				case Opcode::Jump:
				case Opcode::JumpFalse:
				case Opcode::JumpFalseCheck:
				case Opcode::JumpTrue:
				case Opcode::JumpTrueCheck:
				case Opcode::PopCount:
				case Opcode::PushColl:
				case Opcode::PushList:
				{
					uint32_t count;
					reader.Read(&count);
					LogWrite(LogLevel::Info, "%i", count);
				}
				break;
				case Opcode::PushVal:
				{
					Variant val;
					val.Read(reader);
					if (val.IsString())
						LogWrite(LogLevel::Info, "\"%s\"", val.GetString().c_str());
					else if (val.IsFunction())
						LogWrite(LogLevel::Info, "%s", parser.GetNameFromID(val.GetFunction()).c_str());
					else
						LogWrite(LogLevel::Info, "%s", val.GetString().c_str());
				}
				break;
				case Opcode::SetIndex:
				{
					RuntimeID id;
					reader.Read(&id);
					int32_t stackIndex;
					reader.Read(&stackIndex);
					ValueType type;
					reader.Read<ValueType, uint8_t>(&type);
					LogWrite(LogLevel::Info, "%s %i %s", parser.GetNameFromID(id).c_str(), stackIndex, GetValueTypeName(type));
				}
				break;
				default:
				{
				}
				break;
			}
			LogWrite(LogLevel::Info, "\n");
		}
		LogWrite(LogLevel::Info, "\nInstruction Count: %i\n\n", instructionCount);
	}